

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O3

Error llvm::
      handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload
                ,anon_class_48_6_0fa2c5c1 *Handler,anon_class_40_5_28e94b40 *Handlers)

{
  uint *puVar1;
  StringRef *Vals_2;
  char cVar2;
  raw_ostream *prVar3;
  DWARFVerifier *pDVar4;
  ErrorInfoBase *pEVar5;
  undefined8 *in_RCX;
  char *__function;
  undefined1 in_R8B;
  StringRef Fmt;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_108;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
  local_70;
  unsigned_long local_40;
  uint local_34;
  
  cVar2 = (**(code **)(*(long *)Handler->NumEntries + 0x30))
                    (Handler->NumEntries,&DWARFDebugNames::SentinelError::ID);
  puVar1 = Handler->NumEntries;
  Handler->NumEntries = (uint *)0x0;
  if (cVar2 == '\0') {
    pEVar5 = (ErrorInfoBase *)(**(code **)(*(long *)puVar1 + 0x30))(puVar1,&ErrorInfoBase::ID);
    if ((char)pEVar5 == '\0') {
      (Payload->_M_t).
      super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
      super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
      super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl =
           (ErrorInfoBase *)((ulong)puVar1 | 1);
      return (Error)pEVar5;
    }
    cVar2 = (**(code **)(*(long *)puVar1 + 0x30))(puVar1,&ErrorInfoBase::ID);
    if (cVar2 == '\0') {
      __function = 
      "static Error llvm::ErrorHandlerTraits<void (&)(llvm::ErrorInfoBase &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::ErrorInfoBase &), HandlerT = (lambda at /workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp:1270:19)]"
      ;
      goto LAB_00b11249;
    }
    prVar3 = WithColor::error(*(WithColor **)*in_RCX,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    local_40 = *(unsigned_long *)(in_RCX[1] + 0x60);
    local_34 = *(uint *)(in_RCX[2] + 0x18);
    Vals_2 = (StringRef *)in_RCX[3];
    (**(code **)(*(long *)puVar1 + 0x18))(&local_70,puVar1);
    formatv<unsigned_long,_unsigned_int,_llvm::StringRef_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              (&local_108,"Name Index @ {0:x}: Name {1} ({2}): {3}\n",&local_40,&local_34,Vals_2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_70);
    raw_ostream::operator<<(prVar3,&local_108.super_formatv_object_base);
    local_108.Parameters.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
    ._M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d785c8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108.Parameters.
           super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
           ._M_head_impl.Item._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_108.Parameters.
                   super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 0x18U)) {
      operator_delete(local_108.Parameters.
                      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_head_impl.Item._M_dataplus._M_p,
                      local_108.Parameters.
                      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<3UL,_llvm::detail::provider_format_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                      ._M_head_impl.Item.field_2._M_allocated_capacity + 1);
    }
    if (local_108.super_formatv_object_base.Replacements.
        super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super_formatv_object_base.Replacements.
                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.super_formatv_object_base.Adapters.
        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super_formatv_object_base.Adapters.
                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((_Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false> *)
        local_70.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
        .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>.
        super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
        _M_head_impl.super_format_adapter._vptr_format_adapter !=
        &local_70.
         super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
         .
         super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
         .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>) {
      operator_delete(local_70.
                      super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                      .
                      super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                      .
                      super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                      .
                      super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>
                      ._M_head_impl.super_format_adapter._vptr_format_adapter,
                      (long)local_70.
                            super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                            .
                            super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
                            .
                            super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>
                            ._M_head_impl.super_format_adapter._vptr_format_adapter + 1);
    }
    pDVar4 = (DWARFVerifier *)in_RCX[4];
  }
  else {
    cVar2 = (**(code **)(*(long *)puVar1 + 0x30))(puVar1,&DWARFDebugNames::SentinelError::ID);
    if (cVar2 == '\0') {
      __function = 
      "static Error llvm::ErrorHandlerTraits<void (&)(llvm::DWARFDebugNames::SentinelError &)>::apply(HandlerT &&, std::unique_ptr<ErrorInfoBase>) [HandlerT = void (&)(llvm::DWARFDebugNames::SentinelError &), HandlerT = (lambda at /workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFVerifier.cpp:1262:19)]"
      ;
LAB_00b11249:
      __assert_fail("appliesTo(*E) && \"Applying incorrect handler\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                    ,0x329,__function);
    }
    if (*(int *)&Handlers->this->OS != 0) goto LAB_00b111f2;
    prVar3 = WithColor::error((WithColor *)
                              (Handlers->NI->Abbrevs).
                              super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                              .TheMap.Buckets,(raw_ostream *)0xbd4a1c,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    local_70.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl
    .Item = (unsigned_long)Handlers->NTE[2].StrData.Data.Data;
    local_70.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>._M_head_impl.
    Item = (uint)Handlers->Str[1].Length;
    local_70.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>.
    super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
    _M_head_impl.Item = (StringRef *)Handlers->NumErrors;
    local_70.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>.
    super__Head_base<2UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
    _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d78598;
    local_70.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .
    super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_int>,_false>._M_head_impl.
    super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d78200;
    local_70.
    super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>
    .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>._M_head_impl
    .super_format_adapter._vptr_format_adapter = (_func_int **)&PTR_anchor_00d78170;
    Fmt.Length = 0x47;
    Fmt.Data = "Name Index @ {0:x}: Name {1} ({2}) is not associated with any entries.\n";
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
    ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>_>_>
                      *)&local_108,Fmt,&local_70);
    raw_ostream::operator<<(prVar3,&local_108.super_formatv_object_base);
    if (local_108.super_formatv_object_base.Replacements.
        super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super_formatv_object_base.Replacements.
                      super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super_formatv_object_base.Replacements.
                            super__Vector_base<llvm::ReplacementItem,_std::allocator<llvm::ReplacementItem>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.super_formatv_object_base.Adapters.
        super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.super_formatv_object_base.Adapters.
                      super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.super_formatv_object_base.Adapters.
                            super__Vector_base<llvm::detail::format_adapter_*,_std::allocator<llvm::detail::format_adapter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    pDVar4 = Handlers[1].this;
  }
  *(int *)&pDVar4->OS = *(int *)&pDVar4->OS + 1;
LAB_00b111f2:
  (Payload->_M_t).
  super___uniq_ptr_impl<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>._M_t.
  super__Tuple_impl<0UL,_llvm::ErrorInfoBase_*,_std::default_delete<llvm::ErrorInfoBase>_>.
  super__Head_base<0UL,_llvm::ErrorInfoBase_*,_false>._M_head_impl = (ErrorInfoBase *)0x1;
  pEVar5 = (ErrorInfoBase *)(**(code **)(*(long *)puVar1 + 8))(puVar1);
  return (Error)pEVar5;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}